

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O1

void duckdb::roaring::RoaringStateAppender<duckdb::roaring::RoaringCompressState>::AppendVector
               (RoaringCompressState *state,Vector *input,idx_t input_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  UnifiedVectorFormat unified;
  ulong local_a0;
  ulong local_98;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (input_size != 0) {
      uVar6 = 0;
      do {
        uVar4 = 0x800 - ((ulong)(state->container_state).length +
                        (ulong)(state->container_state).appended_count);
        uVar1 = input_size - uVar6;
        if (uVar4 < input_size - uVar6) {
          uVar1 = uVar4;
        }
        RoaringCompressState::HandleAllValid(state,uVar1);
        if ((uint)(state->container_state).length + (uint)(state->container_state).appended_count ==
            0x800) {
          RoaringCompressState::FlushContainer(state);
          RoaringCompressState::InitializeContainer(state);
        }
        uVar6 = uVar6 + uVar1;
      } while (uVar6 < input_size);
    }
  }
  else if (input_size != 0) {
    local_98 = 0;
    do {
      uVar1 = 0x800 - ((ulong)(state->container_state).length +
                      (ulong)(state->container_state).appended_count);
      uVar6 = input_size - local_98;
      if (uVar1 < input_size - local_98) {
        uVar6 = uVar1;
      }
      local_a0 = local_98 >> 6;
      uVar1 = local_98 & 0x3f;
      if (uVar1 != 0) {
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [local_a0];
        }
        uVar2 = 0x40 - uVar1;
        if (uVar6 < uVar2) {
          uVar3 = (ulong)(&ValidityUncompressed::UPPER_MASKS)[uVar6] >>
                  ((char)uVar2 - (char)uVar6 & 0x3fU);
          uVar2 = uVar6;
        }
        else {
          uVar3 = (&ValidityUncompressed::UPPER_MASKS)[uVar2];
        }
        uVar1 = (uVar3 & uVar4) >> (sbyte)uVar1;
        if (uVar1 == *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar2 * 8)) {
          RoaringCompressState::HandleAllValid(state,uVar2);
        }
        else if (uVar1 == 0) {
          RoaringCompressState::HandleNoneValid(state,uVar2);
        }
        else {
          AppendBytes(state,uVar1,uVar2);
        }
        uVar6 = uVar6 - uVar2;
        local_98 = local_98 + uVar2;
        local_a0 = local_a0 + 1;
      }
      if (0x3f < uVar6) {
        uVar1 = 0;
        do {
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            uVar4 = 0xffffffffffffffff;
          }
          else {
            uVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [local_a0 + uVar1];
          }
          if (uVar4 == 0xffffffffffffffff) {
            RoaringCompressState::HandleAllValid(state,0x40);
          }
          else if (uVar4 == 0) {
            RoaringCompressState::HandleNoneValid(state,0x40);
          }
          else {
            lVar7 = 0x38;
            bVar5 = 0;
            do {
              RoaringCompressState::HandleByte
                        (state,(uint8_t)((0xff00000000000000U >> ((byte)lVar7 & 0x3f) & uVar4) >>
                                        (bVar5 & 0x3f)));
              lVar7 = lVar7 + -8;
              bVar5 = bVar5 + 8;
            } while (lVar7 != -8);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 != uVar6 >> 6);
      }
      uVar1 = uVar6 & 0x3f;
      if (uVar1 != 0) {
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [local_a0 + (uVar6 >> 6)];
        }
        uVar2 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8) & uVar4;
        if (uVar2 == *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8)) {
          RoaringCompressState::HandleAllValid(state,uVar1);
        }
        else if (uVar2 == 0) {
          RoaringCompressState::HandleNoneValid(state,uVar1);
        }
        else {
          AppendBytes(state,uVar4,uVar1);
        }
      }
      if ((uint)(state->container_state).length + (uint)(state->container_state).appended_count ==
          0x800) {
        RoaringCompressState::FlushContainer(state);
        RoaringCompressState::InitializeContainer(state);
      }
      local_98 = local_98 + uVar6;
    } while (local_98 < input_size);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void AppendVector(STATE_TYPE &state, Vector &input, idx_t input_size) {
		UnifiedVectorFormat unified;
		input.ToUnifiedFormat(input_size, unified);
		auto &validity = unified.validity;

		if (validity.AllValid()) {
			// All bits are set implicitly
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);
				STATE_TYPE::HandleAllValid(state, to_append);
				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		} else {
			// There is a validity mask
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);

				// Deal with a ragged start, when 'appended' isn't a multiple of ValidityMask::BITS_PER_VALUE
				// then we need to process the remainder of the entry
				idx_t entry_offset = appended / ValidityMask::BITS_PER_VALUE;
				auto previous_entry_remainder = appended % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(previous_entry_remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset);

					idx_t to_process = ValidityMask::BITS_PER_VALUE - previous_entry_remainder;
					validity_t mask;
					if (to_append < to_process) {
						// Limit the amount of bits to set
						auto left_bits = to_process - to_append;
						to_process = to_append;
						mask = ValidityUncompressed::UPPER_MASKS[to_process] >> left_bits;
					} else {
						mask = ValidityUncompressed::UPPER_MASKS[to_process];
					}

					auto masked_entry = (validity_entry & mask) >> previous_entry_remainder;
					if (masked_entry == ValidityUncompressed::LOWER_MASKS[to_process]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, to_process);
					} else if (masked_entry == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, to_process);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, masked_entry, to_process);
					}

					to_append -= to_process;
					appended += to_process;
					entry_offset++;
				}

				auto entry_count = to_append / ValidityMask::BITS_PER_VALUE;
				for (idx_t entry_index = 0; entry_index < entry_count; entry_index++) {
					// get the validity entry at this index
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_index);
					if (ValidityMask::AllValid(validity_entry)) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, ValidityMask::BITS_PER_VALUE);
					} else if (ValidityMask::NoneValid(validity_entry)) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, ValidityMask::BITS_PER_VALUE);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, validity_entry, ValidityMask::BITS_PER_VALUE);
					}
				}

				// Deal with a ragged end, when the validity entry isn't entirely used
				idx_t remainder = to_append % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_count);
					auto masked = validity_entry & ValidityUncompressed::LOWER_MASKS[remainder];
					if (masked == ValidityUncompressed::LOWER_MASKS[remainder]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, remainder);
					} else if (masked == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, remainder);
					} else {
						AppendBytes(state, validity_entry, remainder);
					}
				}

				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		}
	}